

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O2

_Bool quest_check(player *p,monster *m)

{
  uint32_t *puVar1;
  ushort uVar2;
  quest *pqVar3;
  player_upkeep *ppVar4;
  _Bool _Var5;
  long lVar6;
  byte bVar7;
  bool bVar8;
  chunk_conflict *c;
  int iVar9;
  int iVar10;
  loc grid;
  loc local_38;
  
  c = cave;
  uVar2 = z_info->quest_max;
  iVar10 = 0;
  bVar8 = false;
  for (lVar6 = 0; (ulong)uVar2 * 0x30 - lVar6 != 0; lVar6 = lVar6 + 0x30) {
    pqVar3 = p->quests;
    bVar7 = (&pqVar3->level)[lVar6];
    if (((c->depth == (uint)bVar7) && (m->race == *(monster_race **)((long)&pqVar3->race + lVar6)))
       && (iVar9 = *(int *)((long)&pqVar3->cur_num + lVar6) + 1,
          *(int *)((long)&pqVar3->cur_num + lVar6) = iVar9,
          iVar9 == *(int *)((long)&pqVar3->max_num + lVar6))) {
      (&pqVar3->level)[lVar6] = '\0';
      bVar8 = true;
      bVar7 = 0;
    }
    iVar10 = (iVar10 + 1) - (uint)(bVar7 == 0);
  }
  if (bVar8) {
    grid.x = (m->grid).x;
    grid.y = (m->grid).y;
    local_38.x = (p->grid).x;
    local_38.y = (p->grid).y;
    while( true ) {
      _Var5 = square_changeable(c,grid);
      if (_Var5) break;
      _Var5 = square_ispassable(cave,grid);
      if (!_Var5) break;
      _Var5 = square_isdoor(cave,grid);
      if (_Var5) break;
      scatter(cave,&local_38,grid,L'\x01',false);
      c = cave;
      grid = local_38;
    }
    push_object(grid);
    msg("A magical staircase appears...");
    square_set_feat(cave,grid,L'\x06');
    ppVar4 = p->upkeep;
    puVar1 = &ppVar4->update;
    *puVar1 = *puVar1 | 0x60;
    if (iVar10 == 0) {
      p->total_winner = 1;
      puVar1 = &ppVar4->redraw;
      *(byte *)puVar1 = (byte)*puVar1 | 2;
      msg("*** CONGRATULATIONS ***");
      msg("You have won the game!");
      msg("You may retire (key is shift-q) when you are ready.");
    }
  }
  return bVar8;
}

Assistant:

bool quest_check(struct player *p, const struct monster *m)
{
	int i, total = 0;
	bool completed = false;

	/* Mark quests as complete */
	for (i = 0; i < z_info->quest_max; i++) {
		/* Note completed quests */
		if (cave->depth == p->quests[i].level &&
		    m->race == p->quests[i].race) {
			p->quests[i].cur_num++;

			if (p->quests[i].cur_num == p->quests[i].max_num) {
				p->quests[i].level = 0;
				completed = true;
			}
		}

		/* Count incomplete quests */
		if (p->quests[i].level) total++;
	}

	if (completed) {
		/* Build magical stairs */
		build_quest_stairs(p, m->grid);

		/* Nothing left, game over... */
		if (total == 0) {
			p->total_winner = true;
			p->upkeep->redraw |= (PR_TITLE);
			msg("*** CONGRATULATIONS ***");
			msg("You have won the game!");
			msg("You may retire (key is shift-q) when you are ready.");
		}

		return true;
	} else {
		return false;
	}
}